

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

bool __thiscall
Hospital::Validate_Nurse_To_Enter
          (Hospital *this,string *username,string *password,
          vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  ulong uVar4;
  string *psVar5;
  pointer pNVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  string username_1;
  string local_78;
  string *local_58;
  string local_50;
  
  pNVar6 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = password;
  if ((All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
      super__Vector_impl_data._M_finish != pNVar6) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      Human::User_name_Getter_abi_cxx11_
                (&local_78,(Human *)((long)&(pNVar6->super_Human).Id._M_dataplus._M_p + lVar8));
      if ((local_78._M_string_length == username->_M_string_length) &&
         ((local_78._M_string_length == 0 ||
          (iVar3 = bcmp(local_78._M_dataplus._M_p,(username->_M_dataplus)._M_p,
                        local_78._M_string_length), iVar3 == 0)))) {
        Human::Password_Getter_abi_cxx11_
                  (&local_50,
                   (Human *)((long)&(((All_Of_Nurses->
                                      super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                                      super__Vector_impl_data._M_start)->super_Human).Id._M_dataplus
                            + lVar8));
        _Var2._M_p = local_50._M_dataplus._M_p;
        if (local_50._M_string_length == local_58->_M_string_length) {
          if (local_50._M_string_length == 0) {
            bVar9 = true;
          }
          else {
            iVar3 = bcmp(local_50._M_dataplus._M_p,(local_58->_M_dataplus)._M_p,
                         local_50._M_string_length);
            bVar9 = iVar3 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_50.field_2) {
          operator_delete(_Var2._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        psVar5 = (string *)__cxa_allocate_exception(0x20);
        *(string **)psVar5 = psVar5 + 0x10;
        pcVar1 = (username->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>(psVar5,pcVar1,pcVar1 + username->_M_string_length)
        ;
        __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      uVar7 = uVar7 + 1;
      pNVar6 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar6 >> 3) * -0x7d05f417d05f417d;
      lVar8 = lVar8 + 0x158;
    } while (uVar7 <= uVar4 && uVar4 - uVar7 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"your username or password is incorrect .",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return false;
}

Assistant:

bool Hospital :: Validate_Nurse_To_Enter (string username , string password , vector<Nurse> All_Of_Nurses){
    int cntr = 0;

    for (int i = 0; i < All_Of_Nurses.size(); ++i) {
        if (All_Of_Nurses[i].User_name_Getter() == username && All_Of_Nurses[i].Password_Getter() == password) {
            cntr++;
            break;
        }
    }

    try {
        if (cntr == 0) {
            cout << "your username or password is incorrect ." << endl;
            return false;
        } else throw username;
    }
    catch (string username) {
        cout << "you entered successfully ." << endl;
        return true;
    }
}